

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O1

error<idx2::idx2_err_code> __thiscall
idx2::InitFromBuffer(idx2 *this,idx2_file *Idx2,params *P,buffer *Buf)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint unaff_R12D;
  uint uVar4;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar5;
  stref Dir;
  
  Dir.field_0._4_4_ = 0;
  Dir.field_0._0_4_ = (uint)(Idx2->DecodeSubbandSpacings).Arr[2].Capacity;
  Dir._8_8_ = Buf;
  SetDir(this,(idx2_file *)(Idx2->DecodeSubbandSpacings).Arr[2].Size,Dir);
  SetDownsamplingFactor((idx2_file *)this,(v3i *)&(Idx2->DecodeSubbandSpacings).Arr[1].Alloc);
  eVar5 = ReadMetaFileFromBuffer((idx2_file *)this,(buffer *)P);
  if (eVar5.Code != NoError) {
    if ('?' < eVar5.StackIdx) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                    ,0xd,
                    "auto idx2::InitFromBuffer(idx2_file *, params &, buffer &)::(anonymous class)::operator()() const"
                   );
    }
    bVar3 = eVar5.StackIdx + 1;
    unaff_R12D = eVar5._8_4_ & 0xff00ff | (uint)bVar3 << 8;
    *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar3 * 4) = 0xd;
    *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar3 * 8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp";
    P = (params *)eVar5.Msg;
  }
  if (eVar5.Code == NoError) {
    eVar5 = Finalize((idx2_file *)this,(params *)Idx2);
    if (eVar5.Code != NoError) {
      if ('?' < eVar5.StackIdx) {
        __assert_fail("false && \"stack too deep\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                      ,0xe,
                      "auto idx2::InitFromBuffer(idx2_file *, params &, buffer &)::(anonymous class)::operator()() const"
                     );
      }
      bVar3 = eVar5.StackIdx + 1;
      unaff_R12D = eVar5._8_4_ & 0xff00ff | (uint)bVar3 << 8;
      *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar3 * 4) = 0xe;
      *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar3 * 8) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      P = (params *)eVar5.Msg;
    }
    if (eVar5.Code == NoError) {
      if (((Idx2->DecodeSubbandSpacings).Arr[1].Capacity & 0x7fffffffffffffffU) == 0) {
        uVar4 = *(uint *)(this + 0x80);
        uVar1 = *(uint *)(this + 0x84);
        uVar2 = *(uint *)(this + 0x88);
        (Idx2->DecodeSubbandSpacings).Arr[1].Size = 0;
        (Idx2->DecodeSubbandSpacings).Arr[1].Capacity =
             (ulong)(uVar2 & 0x1fffff) << 0x2a |
             ((ulong)uVar1 & 0x1fffff) << 0x15 | (ulong)uVar4 & 0x1fffff;
      }
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x12;
      unaff_R12D = 0;
      P = (params *)0x1bd71d;
    }
  }
  uVar4 = unaff_R12D & 0xffffff;
  eVar5.Code = (char)uVar4;
  eVar5.StackIdx = (char)(uVar4 >> 8);
  eVar5.StrGened = (bool)(char)(uVar4 >> 0x10);
  eVar5._11_1_ = (char)(uVar4 >> 0x18);
  eVar5.Msg = (cstr)P;
  eVar5._12_4_ = 0;
  return eVar5;
}

Assistant:

error<idx2_err_code>
InitFromBuffer(idx2_file* Idx2, params& P, buffer& Buf)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFileFromBuffer(Idx2, Buf));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a
                                      // single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}